

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void helper_msa_adds_a_h_mipsel(CPUMIPSState_conflict4 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  ushort uVar1;
  long lVar2;
  ushort uVar3;
  long lVar4;
  long lVar5;
  short sVar6;
  ushort uVar7;
  
  lVar2 = (ulong)wd * 0x10;
  lVar4 = (ulong)ws * 0x10;
  lVar5 = (ulong)wt * 0x10;
  uVar3 = *(ushort *)((env->active_fpu).fpr + ws);
  uVar1 = *(ushort *)((env->active_fpu).fpr + wt);
  uVar7 = -uVar3;
  if (0 < (short)uVar3) {
    uVar7 = uVar3;
  }
  uVar3 = -uVar1;
  if (0 < (short)uVar1) {
    uVar3 = uVar1;
  }
  sVar6 = uVar3 + uVar7;
  if (0x7fff - (ulong)uVar3 <= (ulong)uVar7) {
    sVar6 = 0x7fff;
  }
  if ((short)(uVar3 | uVar7) < 0) {
    sVar6 = 0x7fff;
  }
  *(short *)((env->active_fpu).fpr + wd) = sVar6;
  uVar3 = *(ushort *)((long)(env->active_fpu).fpr + lVar4 + 2);
  uVar1 = *(ushort *)((long)(env->active_fpu).fpr + lVar5 + 2);
  uVar7 = -uVar3;
  if (0 < (short)uVar3) {
    uVar7 = uVar3;
  }
  uVar3 = -uVar1;
  if (0 < (short)uVar1) {
    uVar3 = uVar1;
  }
  sVar6 = uVar3 + uVar7;
  if (0x7fff - (ulong)uVar3 <= (ulong)uVar7) {
    sVar6 = 0x7fff;
  }
  if ((short)(uVar3 | uVar7) < 0) {
    sVar6 = 0x7fff;
  }
  *(short *)((long)(env->active_fpu).fpr + lVar2 + 2) = sVar6;
  uVar3 = *(ushort *)((long)(env->active_fpu).fpr + lVar4 + 4);
  uVar1 = *(ushort *)((long)(env->active_fpu).fpr + lVar5 + 4);
  uVar7 = -uVar3;
  if (0 < (short)uVar3) {
    uVar7 = uVar3;
  }
  uVar3 = -uVar1;
  if (0 < (short)uVar1) {
    uVar3 = uVar1;
  }
  sVar6 = uVar3 + uVar7;
  if (0x7fff - (ulong)uVar3 <= (ulong)uVar7) {
    sVar6 = 0x7fff;
  }
  if ((short)(uVar3 | uVar7) < 0) {
    sVar6 = 0x7fff;
  }
  *(short *)((long)(env->active_fpu).fpr + lVar2 + 4) = sVar6;
  uVar3 = *(ushort *)((long)(env->active_fpu).fpr + lVar4 + 6);
  uVar1 = *(ushort *)((long)(env->active_fpu).fpr + lVar5 + 6);
  uVar7 = -uVar3;
  if (0 < (short)uVar3) {
    uVar7 = uVar3;
  }
  uVar3 = -uVar1;
  if (0 < (short)uVar1) {
    uVar3 = uVar1;
  }
  sVar6 = uVar3 + uVar7;
  if (0x7fff - (ulong)uVar3 <= (ulong)uVar7) {
    sVar6 = 0x7fff;
  }
  if ((short)(uVar3 | uVar7) < 0) {
    sVar6 = 0x7fff;
  }
  *(short *)((long)(env->active_fpu).fpr + lVar2 + 6) = sVar6;
  uVar3 = *(ushort *)((long)(env->active_fpu).fpr + lVar4 + 8);
  uVar1 = *(ushort *)((long)(env->active_fpu).fpr + lVar5 + 8);
  uVar7 = -uVar3;
  if (0 < (short)uVar3) {
    uVar7 = uVar3;
  }
  uVar3 = -uVar1;
  if (0 < (short)uVar1) {
    uVar3 = uVar1;
  }
  sVar6 = uVar3 + uVar7;
  if (0x7fff - (ulong)uVar3 <= (ulong)uVar7) {
    sVar6 = 0x7fff;
  }
  if ((short)(uVar3 | uVar7) < 0) {
    sVar6 = 0x7fff;
  }
  *(short *)((long)(env->active_fpu).fpr + lVar2 + 8) = sVar6;
  uVar3 = *(ushort *)((long)(env->active_fpu).fpr + lVar4 + 10);
  uVar1 = *(ushort *)((long)(env->active_fpu).fpr + lVar5 + 10);
  uVar7 = -uVar3;
  if (0 < (short)uVar3) {
    uVar7 = uVar3;
  }
  uVar3 = -uVar1;
  if (0 < (short)uVar1) {
    uVar3 = uVar1;
  }
  sVar6 = uVar3 + uVar7;
  if (0x7fff - (ulong)uVar3 <= (ulong)uVar7) {
    sVar6 = 0x7fff;
  }
  if ((short)(uVar3 | uVar7) < 0) {
    sVar6 = 0x7fff;
  }
  *(short *)((long)(env->active_fpu).fpr + lVar2 + 10) = sVar6;
  uVar3 = *(ushort *)((long)(env->active_fpu).fpr + lVar4 + 0xc);
  uVar1 = *(ushort *)((long)(env->active_fpu).fpr + lVar5 + 0xc);
  uVar7 = -uVar3;
  if (0 < (short)uVar3) {
    uVar7 = uVar3;
  }
  uVar3 = -uVar1;
  if (0 < (short)uVar1) {
    uVar3 = uVar1;
  }
  sVar6 = uVar3 + uVar7;
  if (0x7fff - (ulong)uVar3 <= (ulong)uVar7) {
    sVar6 = 0x7fff;
  }
  if ((short)(uVar3 | uVar7) < 0) {
    sVar6 = 0x7fff;
  }
  *(short *)((long)(env->active_fpu).fpr + lVar2 + 0xc) = sVar6;
  uVar3 = *(ushort *)((long)(env->active_fpu).fpr + lVar4 + 0xe);
  uVar1 = *(ushort *)((long)(env->active_fpu).fpr + lVar5 + 0xe);
  uVar7 = -uVar3;
  if (0 < (short)uVar3) {
    uVar7 = uVar3;
  }
  uVar3 = -uVar1;
  if (0 < (short)uVar1) {
    uVar3 = uVar1;
  }
  sVar6 = uVar7 + uVar3;
  if (0x7fff - (ulong)uVar3 <= (ulong)uVar7) {
    sVar6 = 0x7fff;
  }
  if ((short)(uVar3 | uVar7) < 0) {
    sVar6 = 0x7fff;
  }
  *(short *)((long)(env->active_fpu).fpr + lVar2 + 0xe) = sVar6;
  return;
}

Assistant:

void helper_msa_adds_a_h(CPUMIPSState *env,
                         uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->h[0]  = msa_adds_a_df(DF_HALF, pws->h[0],  pwt->h[0]);
    pwd->h[1]  = msa_adds_a_df(DF_HALF, pws->h[1],  pwt->h[1]);
    pwd->h[2]  = msa_adds_a_df(DF_HALF, pws->h[2],  pwt->h[2]);
    pwd->h[3]  = msa_adds_a_df(DF_HALF, pws->h[3],  pwt->h[3]);
    pwd->h[4]  = msa_adds_a_df(DF_HALF, pws->h[4],  pwt->h[4]);
    pwd->h[5]  = msa_adds_a_df(DF_HALF, pws->h[5],  pwt->h[5]);
    pwd->h[6]  = msa_adds_a_df(DF_HALF, pws->h[6],  pwt->h[6]);
    pwd->h[7]  = msa_adds_a_df(DF_HALF, pws->h[7],  pwt->h[7]);
}